

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O2

int extend_receive(jpeg *j,int n)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = j->code_bits;
  if (iVar1 < n) {
    grow_buffer_unsafe(j);
    iVar1 = j->code_bits;
  }
  uVar2 = j->code_buffer >> ((byte)(iVar1 - n) & 0x1f) & bmask[(uint)n];
  j->code_bits = iVar1 - n;
  iVar1 = 0;
  if (uVar2 >> ((byte)n - 1 & 0x1f) == 0) {
    iVar1 = (-1 << ((byte)n & 0x1f)) + 1;
  }
  return iVar1 + uVar2;
}

Assistant:

__forceinline static int extend_receive(jpeg *j, int n)
{
   unsigned int m = 1 << (n-1);
   unsigned int k;
   if (j->code_bits < n) grow_buffer_unsafe(j);
   k = (j->code_buffer >> (j->code_bits - n)) & bmask[n];
   j->code_bits -= n;
   // the following test is probably a random branch that won't
   // predict well. I tried to table accelerate it but failed.
   // maybe it's compiling as a conditional move?
   if (k < m)
      return (-1 << n) + k + 1;
   else
      return k;
}